

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O1

void __thiscall
CGraphics_Threaded::QuadsSetSubset
          (CGraphics_Threaded *this,float TlU,float TlV,float BrU,float BrV,int TextureIndex)

{
  int iVar1;
  float fVar2;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/client/graphics_threaded.cpp"
                 ,0x245,(uint)(this->m_Drawing == 1),
                 "called Graphics()->QuadsSetSubset without begin");
  iVar1 = (*this->m_pBackend->_vptr_IGraphicsBackend[5])();
  if ((-1 < TextureIndex) && (1 < iVar1)) {
    TilesetFallbackSystem(this,TextureIndex);
  }
  (this->m_State).m_TextureArrayIndex = this->m_TextureArrayIndex;
  this->m_aTexture[0].u = TlU;
  this->m_aTexture[1].u = BrU;
  this->m_aTexture[0].v = TlV;
  this->m_aTexture[1].v = TlV;
  this->m_aTexture[3].u = TlU;
  this->m_aTexture[2].u = BrU;
  this->m_aTexture[3].v = BrV;
  this->m_aTexture[2].v = BrV;
  iVar1 = (*this->m_pBackend->_vptr_IGraphicsBackend[5])();
  fVar2 = ((float)TextureIndex + 0.5) / (256.0 / (float)iVar1);
  this->m_aTexture[3].i = fVar2;
  this->m_aTexture[2].i = fVar2;
  this->m_aTexture[1].i = fVar2;
  this->m_aTexture[0].i = fVar2;
  (this->m_State).m_Dimension = (uint)TextureIndex >> 0x1f ^ 3;
  return;
}

Assistant:

void CGraphics_Threaded::QuadsSetSubset(float TlU, float TlV, float BrU, float BrV, int TextureIndex)
{
	dbg_assert(m_Drawing == DRAWING_QUADS, "called Graphics()->QuadsSetSubset without begin");

	// tileset fallback system
	if(m_pBackend->GetTextureArraySize() > 1 && TextureIndex >= 0)
		TilesetFallbackSystem(TextureIndex);

	m_State.m_TextureArrayIndex = m_TextureArrayIndex;

	m_aTexture[0].u = TlU;	m_aTexture[1].u = BrU;
	m_aTexture[0].v = TlV;	m_aTexture[1].v = TlV;

	m_aTexture[3].u = TlU;	m_aTexture[2].u = BrU;
	m_aTexture[3].v = BrV;	m_aTexture[2].v = BrV;

	m_aTexture[0].i = m_aTexture[1].i = m_aTexture[2].i = m_aTexture[3].i = (0.5f + TextureIndex) / (256.0f/m_pBackend->GetTextureArraySize());
	m_State.m_Dimension = (TextureIndex < 0) ? 2 : 3;
}